

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::CLUFactor<double>::vSolveLright2
          (CLUFactor<double> *this,double *vec,int *ridx,int *rn,double eps,double *vec2,int *ridx2,
          int *rn2,double eps2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  pointer pdVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  uint local_50;
  
  pdVar4 = (this->l).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->l).idx;
  piVar6 = (this->l).row;
  piVar7 = (this->l).start;
  local_50 = (this->l).firstUpdate;
  if ((long)(int)local_50 < 1) {
    local_50 = 0;
  }
  else {
    lVar10 = 0;
    do {
      iVar1 = piVar6[lVar10];
      dVar14 = vec2[iVar1];
      dVar16 = vec[iVar1];
      if (ABS(dVar16) <= eps) {
        if (eps2 < ABS(dVar14)) {
          iVar1 = piVar7[lVar10];
          iVar9 = piVar7[lVar10 + 1];
          if (iVar1 < iVar9) {
            lVar8 = (long)iVar1 * 4;
            do {
              iVar2 = *(int *)((long)piVar5 + lVar8);
              dVar16 = *(double *)((long)pdVar4 + lVar8 * 2);
              dVar17 = vec2[iVar2];
              if ((dVar17 == 0.0) && (!NAN(dVar17))) {
                ridx2[*rn2] = iVar2;
                *rn2 = *rn2 + 1;
              }
              dVar17 = dVar17 - dVar16 * dVar14;
              uVar11 = -(ulong)(dVar17 == 0.0);
              vec2[iVar2] = (double)(uVar11 & 0x2b2bff2ee48e0530 | ~uVar11 & (ulong)dVar17);
              iVar9 = iVar9 + -1;
              lVar8 = lVar8 + 4;
            } while (iVar1 < iVar9);
          }
        }
      }
      else {
        iVar1 = piVar7[lVar10];
        iVar9 = piVar7[lVar10 + 1];
        if (ABS(dVar14) <= eps2) {
          if (iVar1 < iVar9) {
            lVar8 = (long)iVar1 * 4;
            do {
              iVar2 = *(int *)((long)piVar5 + lVar8);
              dVar14 = *(double *)((long)pdVar4 + lVar8 * 2);
              dVar17 = vec[iVar2];
              if ((dVar17 == 0.0) && (!NAN(dVar17))) {
                ridx[*rn] = iVar2;
                *rn = *rn + 1;
              }
              dVar17 = dVar17 - dVar14 * dVar16;
              uVar11 = -(ulong)(dVar17 == 0.0);
              vec[iVar2] = (double)(uVar11 & 0x2b2bff2ee48e0530 | ~uVar11 & (ulong)dVar17);
              iVar9 = iVar9 + -1;
              lVar8 = lVar8 + 4;
            } while (iVar1 < iVar9);
          }
        }
        else if (iVar1 < iVar9) {
          lVar8 = (long)iVar1 * 4;
          do {
            iVar2 = *(int *)((long)piVar5 + lVar8);
            dVar17 = *(double *)((long)pdVar4 + lVar8 * 2);
            dVar18 = vec[iVar2];
            if ((dVar18 == 0.0) && (!NAN(dVar18))) {
              ridx[*rn] = iVar2;
              *rn = *rn + 1;
            }
            dVar18 = dVar18 - dVar17 * dVar16;
            uVar11 = -(ulong)(dVar18 == 0.0);
            vec[iVar2] = (double)(uVar11 & 0x2b2bff2ee48e0530 | ~uVar11 & (ulong)dVar18);
            dVar17 = *(double *)((long)pdVar4 + lVar8 * 2);
            dVar18 = vec2[iVar2];
            if ((dVar18 == 0.0) && (!NAN(dVar18))) {
              ridx2[*rn2] = iVar2;
              *rn2 = *rn2 + 1;
            }
            dVar18 = dVar18 - dVar17 * dVar14;
            uVar11 = -(ulong)(dVar18 == 0.0);
            vec2[iVar2] = (double)(uVar11 & 0x2b2bff2ee48e0530 | ~uVar11 & (ulong)dVar18);
            iVar9 = iVar9 + -1;
            lVar8 = lVar8 + 4;
          } while (iVar1 < iVar9);
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != (int)local_50);
  }
  if (((this->l).updateType != 0) && (uVar3 = (this->l).firstUnused, (int)local_50 < (int)uVar3)) {
    uVar11 = (ulong)local_50;
    do {
      iVar1 = piVar7[uVar11];
      iVar9 = piVar7[uVar11 + 1];
      dVar14 = 0.0;
      dVar16 = 0.0;
      if (iVar1 < iVar9) {
        lVar10 = (long)iVar1 * 4;
        dVar17 = 0.0;
        dVar18 = 0.0;
        do {
          dVar20 = *(double *)((long)pdVar4 + lVar10 * 2);
          dVar19 = vec[*(int *)((long)piVar5 + lVar10)] * dVar20;
          dVar20 = vec2[*(int *)((long)piVar5 + lVar10)] * dVar20;
          dVar13 = dVar14 + dVar19;
          dVar15 = dVar16 + dVar20;
          dVar17 = dVar17 + (dVar19 - (dVar13 - dVar14)) + (dVar14 - (dVar13 - (dVar13 - dVar14)));
          dVar18 = dVar18 + (dVar20 - (dVar15 - dVar16)) + (dVar16 - (dVar15 - (dVar15 - dVar16)));
          iVar9 = iVar9 + -1;
          lVar10 = lVar10 + 4;
          dVar14 = dVar13;
          dVar16 = dVar15;
        } while (iVar1 < iVar9);
        dVar14 = dVar13 + dVar17;
        dVar16 = dVar15 + dVar18;
      }
      iVar1 = piVar6[uVar11];
      if (eps < ABS(dVar14)) {
        dVar17 = vec[iVar1];
        if ((dVar17 == 0.0) && (!NAN(dVar17))) {
          ridx[*rn] = iVar1;
          *rn = *rn + 1;
        }
        uVar12 = -(ulong)(dVar17 - dVar14 == 0.0);
        vec[iVar1] = (double)(uVar12 & 0x2b2bff2ee48e0530 | ~uVar12 & (ulong)(dVar17 - dVar14));
      }
      if (eps2 < ABS(dVar16)) {
        dVar14 = vec2[iVar1];
        if ((dVar14 == 0.0) && (!NAN(dVar14))) {
          ridx2[*rn2] = iVar1;
          *rn2 = *rn2 + 1;
        }
        uVar12 = -(ulong)(dVar14 - dVar16 == 0.0);
        vec2[iVar1] = (double)(uVar12 & 0x2b2bff2ee48e0530 | ~uVar12 & (ulong)(dVar14 - dVar16));
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar3);
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveLright2(
   R* vec, int* ridx, int& rn, R eps,
   R* vec2, int* ridx2, int& rn2, R eps2)
{
   int i, j, k, n;
   int end;
   R x, x2;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   // loop through columns of L
   for(i = 0; i < end; ++i)
   {
      j = lrow[i];
      x2 = vec2[j];
      x = vec[j];

      // check whether there is a corresponding value in the first rhs VectorBase<R>; skipping/ignoring FACTOR_MARKER
      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         // check whether there is  also a corresponding value in the second rhs VectorBase<R>; skipping/ignoring FACTOR_MARKER
         if(isNotZero(x2, eps2))
         {
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
               ++val;
            }
         }
         // only the first VectorBase<R> needs to be modified
         else
         {
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               ++val;
            }
         }
      }
      // only the second VectorBase<R> needs to be modified
      else if(isNotZero(x2, eps2))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            n = *idx++;
            updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
            ++val;
         }
      }
   }

   if(l.updateType)                     /* Forest-Tomlin Updates */
   {
      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         StableSum<R> tmp1, tmp2;

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            tmp1 += vec[*idx] * (*val);
            tmp2 += vec2[*idx++] * (*val++);
         }

         x = R(tmp1);
         x2 = R(tmp2);

         j = lrow[i];

         if(isNotZero(x, eps))
            updateSolutionVectorLright(x, j, vec[j], ridx, rn);

         if(isNotZero(x2, eps2))
            updateSolutionVectorLright(x2, j, vec2[j], ridx2, rn2);
      }
   }
}